

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase *
MatchGenericType(ExpressionContext *ctx,SynBase *source,TypeBase *matchType,TypeBase *argType,
                IntrusiveList<MatchData> *aliases,bool strict)

{
  IntrusiveList<TypeHandle> arguments_00;
  bool bVar1;
  TypeBase *pTVar2;
  TypeGenericAlias *pTVar3;
  TypeArray *pTVar4;
  MatchData *this;
  TypeRef *pTVar5;
  TypeRef *pTVar6;
  TypeArray *pTVar7;
  TypeUnsizedArray *pTVar8;
  TypeUnsizedArray *pTVar9;
  TypeFunction *pTVar10;
  TypeFunction *pTVar11;
  TypeHandle *this_00;
  TypeGenericClass *pTVar12;
  TypeClass *pTVar13;
  TypeGenericClassProto *pTVar14;
  TypeClass *rhs_8;
  TypeGenericClassProto *lhs_6;
  TypeBase *argMatched_1;
  MatchData *rhsArg_1;
  TypeHandle *lhsArg_1;
  TypeClass *rhs_7;
  TypeGenericClass *lhs_5;
  TypeBase *argMatched;
  TypeHandle *rhsArg;
  TypeHandle *lhsArg;
  IntrusiveList<TypeHandle> arguments;
  TypeBase *returnType;
  TypeFunction *rhs_6;
  TypeFunction *lhs_4;
  TypeBase *match_4;
  TypeArray *rhs_5;
  TypeBase *match_3;
  TypeUnsizedArray *rhs_4;
  TypeUnsizedArray *lhs_3;
  TypeBase *match_2;
  TypeArray *rhs_3;
  TypeArray *lhs_2;
  TypeBase *match_1;
  TypeBase *match;
  TypeRef *rhs_2;
  TypeRef *lhs_1;
  MatchData *curr;
  TypeArray *rhs_1;
  TypeGenericAlias *lhs;
  TypeArray *rhs;
  TypeBase *improved;
  IntrusiveList<MatchData> subAliases;
  bool strict_local;
  IntrusiveList<MatchData> *aliases_local;
  TypeBase *argType_local;
  TypeBase *matchType_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  subAliases.tail._7_1_ = strict;
  if ((matchType->isGeneric & 1U) == 0) {
    aliases_local = (IntrusiveList<MatchData> *)argType;
    if ((argType->isGeneric & 1U) != 0) {
      IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&improved);
      pTVar2 = MatchGenericType(ctx,source,argType,matchType,(IntrusiveList<MatchData> *)&improved,
                                true);
      aliases_local = (IntrusiveList<MatchData> *)argType;
      if (pTVar2 != (TypeBase *)0x0) {
        aliases_local = (IntrusiveList<MatchData> *)pTVar2;
      }
    }
    if (matchType == (TypeBase *)aliases_local) {
      ctx_local = (ExpressionContext *)aliases_local;
    }
    else {
      ctx_local = (ExpressionContext *)matchType;
      if ((subAliases.tail._7_1_ & 1) != 0) {
        ctx_local = (ExpressionContext *)0x0;
      }
    }
  }
  else {
    bVar1 = isType<TypeGeneric>(matchType);
    aliases_local = (IntrusiveList<MatchData> *)argType;
    if (bVar1) {
      if (((subAliases.tail._7_1_ & 1) == 0) &&
         (pTVar4 = getType<TypeArray>(argType), pTVar4 != (TypeArray *)0x0)) {
        aliases_local =
             (IntrusiveList<MatchData> *)ExpressionContext::GetUnsizedArrayType(ctx,pTVar4->subType)
        ;
      }
      bVar1 = isType<TypeError>((TypeBase *)aliases_local);
      if (bVar1) {
        ctx_local = (ExpressionContext *)0x0;
      }
      else {
        ctx_local = (ExpressionContext *)aliases_local;
      }
    }
    else {
      pTVar3 = getType<TypeGenericAlias>(matchType);
      if (pTVar3 == (TypeGenericAlias *)0x0) {
        pTVar5 = getType<TypeRef>(matchType);
        if (pTVar5 == (TypeRef *)0x0) {
          pTVar4 = getType<TypeArray>(matchType);
          if (pTVar4 == (TypeArray *)0x0) {
            pTVar8 = getType<TypeUnsizedArray>(matchType);
            if (pTVar8 == (TypeUnsizedArray *)0x0) {
              pTVar10 = getType<TypeFunction>(matchType);
              if (pTVar10 == (TypeFunction *)0x0) {
                pTVar12 = getType<TypeGenericClass>(matchType);
                ctx_local = (ExpressionContext *)argType;
                if (pTVar12 == (TypeGenericClass *)0x0) {
                  pTVar14 = getType<TypeGenericClassProto>(matchType);
                  if (pTVar14 == (TypeGenericClassProto *)0x0) {
                    anon_unknown.dwarf_e7629::Stop(ctx,source,"ERROR: unknown generic type match");
                    ctx_local = (ExpressionContext *)0x0;
                  }
                  else {
                    pTVar13 = getType<TypeClass>(argType);
                    if (pTVar13 == (TypeClass *)0x0) {
                      ctx_local = (ExpressionContext *)0x0;
                    }
                    else if (pTVar14 != pTVar13->proto) {
                      ctx_local = (ExpressionContext *)0x0;
                    }
                  }
                }
                else {
                  pTVar13 = getType<TypeClass>(argType);
                  if (pTVar13 == (TypeClass *)0x0) {
                    ctx_local = (ExpressionContext *)0x0;
                  }
                  else if (pTVar12->proto == pTVar13->proto) {
                    argMatched_1 = (TypeBase *)(pTVar13->generics).head;
                    for (rhsArg_1 = (MatchData *)(pTVar12->generics).head;
                        rhsArg_1 != (MatchData *)0x0 && argMatched_1 != (TypeBase *)0x0;
                        rhsArg_1 = (MatchData *)rhsArg_1->type) {
                      pTVar2 = MatchGenericType(ctx,source,(TypeBase *)rhsArg_1->name,
                                                *(TypeBase **)&argMatched_1->typeID,aliases,true);
                      if (pTVar2 == (TypeBase *)0x0) {
                        return (TypeBase *)0x0;
                      }
                      argMatched_1 = (TypeBase *)(argMatched_1->name).begin;
                    }
                  }
                  else {
                    ctx_local = (ExpressionContext *)0x0;
                  }
                }
              }
              else {
                pTVar11 = getType<TypeFunction>(argType);
                if (pTVar11 == (TypeFunction *)0x0) {
                  ctx_local = (ExpressionContext *)0x0;
                }
                else {
                  arguments.tail =
                       (TypeHandle *)
                       MatchGenericType(ctx,source,pTVar10->returnType,pTVar11->returnType,aliases,
                                        true);
                  if ((TypeBase *)arguments.tail == (TypeBase *)0x0) {
                    ctx_local = (ExpressionContext *)0x0;
                  }
                  else {
                    IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&lhsArg);
                    argMatched = (TypeBase *)(pTVar11->arguments).head;
                    for (rhsArg = (pTVar10->arguments).head;
                        rhsArg != (TypeHandle *)0x0 && argMatched != (TypeBase *)0x0;
                        rhsArg = rhsArg->next) {
                      pTVar2 = MatchGenericType(ctx,source,rhsArg->type,
                                                (TypeBase *)argMatched->_vptr_TypeBase,aliases,true)
                      ;
                      if (pTVar2 == (TypeBase *)0x0) {
                        return (TypeBase *)0x0;
                      }
                      this_00 = ExpressionContext::get<TypeHandle>(ctx);
                      TypeHandle::TypeHandle(this_00,pTVar2);
                      IntrusiveList<TypeHandle>::push_back
                                ((IntrusiveList<TypeHandle> *)&lhsArg,this_00);
                      argMatched = *(TypeBase **)&argMatched->typeID;
                    }
                    if ((rhsArg == (TypeHandle *)0x0) && (argMatched == (TypeBase *)0x0)) {
                      arguments_00.tail = arguments.head;
                      arguments_00.head = lhsArg;
                      ctx_local = (ExpressionContext *)
                                  ExpressionContext::GetFunctionType
                                            (ctx,source,(TypeBase *)arguments.tail,arguments_00);
                    }
                    else {
                      ctx_local = (ExpressionContext *)0x0;
                    }
                  }
                }
              }
            }
            else {
              pTVar9 = getType<TypeUnsizedArray>(argType);
              if (pTVar9 == (TypeUnsizedArray *)0x0) {
                if ((subAliases.tail._7_1_ & 1) == 0) {
                  pTVar4 = getType<TypeArray>(argType);
                  if ((pTVar4 == (TypeArray *)0x0) ||
                     (pTVar2 = MatchGenericType(ctx,source,pTVar8->subType,pTVar4->subType,aliases,
                                                true), pTVar2 == (TypeBase *)0x0)) {
                    ctx_local = (ExpressionContext *)0x0;
                  }
                  else {
                    ctx_local = (ExpressionContext *)
                                ExpressionContext::GetUnsizedArrayType(ctx,pTVar2);
                  }
                }
                else {
                  ctx_local = (ExpressionContext *)0x0;
                }
              }
              else {
                pTVar2 = MatchGenericType(ctx,source,pTVar8->subType,pTVar9->subType,aliases,true);
                if (pTVar2 == (TypeBase *)0x0) {
                  ctx_local = (ExpressionContext *)0x0;
                }
                else {
                  ctx_local = (ExpressionContext *)
                              ExpressionContext::GetUnsizedArrayType(ctx,pTVar2);
                }
              }
            }
          }
          else {
            pTVar7 = getType<TypeArray>(argType);
            if ((pTVar7 == (TypeArray *)0x0) || (pTVar4->length != pTVar7->length)) {
              ctx_local = (ExpressionContext *)0x0;
            }
            else {
              pTVar2 = MatchGenericType(ctx,source,pTVar4->subType,pTVar7->subType,aliases,true);
              if (pTVar2 == (TypeBase *)0x0) {
                ctx_local = (ExpressionContext *)0x0;
              }
              else {
                ctx_local = (ExpressionContext *)
                            ExpressionContext::GetArrayType(ctx,pTVar2,pTVar4->length);
              }
            }
          }
        }
        else {
          pTVar6 = getType<TypeRef>(argType);
          if (pTVar6 == (TypeRef *)0x0) {
            if ((subAliases.tail._7_1_ & 1) == 0) {
              pTVar2 = MatchGenericType(ctx,source,pTVar5->subType,argType,aliases,true);
              if (pTVar2 == (TypeBase *)0x0) {
                ctx_local = (ExpressionContext *)0x0;
              }
              else {
                ctx_local = (ExpressionContext *)ExpressionContext::GetReferenceType(ctx,pTVar2);
              }
            }
            else {
              ctx_local = (ExpressionContext *)0x0;
            }
          }
          else {
            pTVar2 = MatchGenericType(ctx,source,pTVar5->subType,pTVar6->subType,aliases,true);
            if (pTVar2 == (TypeBase *)0x0) {
              ctx_local = (ExpressionContext *)0x0;
            }
            else {
              ctx_local = (ExpressionContext *)ExpressionContext::GetReferenceType(ctx,pTVar2);
            }
          }
        }
      }
      else {
        if (((subAliases.tail._7_1_ & 1) == 0) &&
           (pTVar4 = getType<TypeArray>(argType), pTVar4 != (TypeArray *)0x0)) {
          aliases_local =
               (IntrusiveList<MatchData> *)
               ExpressionContext::GetUnsizedArrayType(ctx,pTVar4->subType);
        }
        for (lhs_1 = (TypeRef *)aliases->head; lhs_1 != (TypeRef *)0x0;
            lhs_1 = (TypeRef *)(lhs_1->super_TypeBase).name.begin) {
          bVar1 = InplaceStr::operator==
                            ((InplaceStr *)((lhs_1->super_TypeBase)._vptr_TypeBase + 8),
                             &pTVar3->baseName->name);
          if (bVar1) {
            if (((subAliases.tail._7_1_ & 1) != 0) &&
               (*(IntrusiveList<MatchData> **)&(lhs_1->super_TypeBase).typeID != aliases_local)) {
              return (TypeBase *)0x0;
            }
            return *(TypeBase **)&(lhs_1->super_TypeBase).typeID;
          }
        }
        bVar1 = isType<TypeError>((TypeBase *)aliases_local);
        if (bVar1) {
          ctx_local = (ExpressionContext *)0x0;
        }
        else {
          bVar1 = isType<TypeArgumentSet>((TypeBase *)aliases_local);
          if (((bVar1) || (bVar1 = isType<TypeMemberSet>((TypeBase *)aliases_local), bVar1)) ||
             (bVar1 = isType<TypeFunctionSet>((TypeBase *)aliases_local), bVar1)) {
            ctx_local = (ExpressionContext *)0x0;
          }
          else {
            this = ExpressionContext::get<MatchData>(ctx);
            MatchData::MatchData(this,pTVar3->baseName,(TypeBase *)aliases_local);
            IntrusiveList<MatchData>::push_back(aliases,this);
            ctx_local = (ExpressionContext *)aliases_local;
          }
        }
      }
    }
  }
  return (TypeBase *)ctx_local;
}

Assistant:

TypeBase* MatchGenericType(ExpressionContext &ctx, SynBase *source, TypeBase *matchType, TypeBase *argType, IntrusiveList<MatchData> &aliases, bool strict)
{
	if(!matchType->isGeneric)
	{
		if(argType->isGeneric)
		{
			IntrusiveList<MatchData> subAliases;

			if(TypeBase *improved = MatchGenericType(ctx, source, argType, matchType, subAliases, true))
				argType = improved;
		}

		if(matchType == argType)
			return argType;

		if(strict)
			return NULL;

		return matchType;
	}

	// 'generic' match with 'type' results with 'type'
	if(isType<TypeGeneric>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		if(isType<TypeError>(argType))
			return NULL;

		return argType;
	}

	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
			{
				if(strict)
				{
					if(curr->type != argType)
						return NULL;
				}

				return curr->type;
			}
		}

		if(isType<TypeError>(argType))
			return NULL;

		if(isType<TypeArgumentSet>(argType) || isType<TypeMemberSet>(argType) || isType<TypeFunctionSet>(argType))
			return NULL;

		aliases.push_back(new (ctx.get<MatchData>()) MatchData(lhs->baseName, argType));

		return argType;
	}

	if(TypeRef *lhs = getType<TypeRef>(matchType))
	{
		// 'generic ref' match with 'type ref' results with 'type ref'
		if(TypeRef *rhs = getType<TypeRef>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetReferenceType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic ref' match with 'type' results with 'type ref'
		if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, argType, aliases, true))
			return ctx.GetReferenceType(match);

		return NULL;
	}

	if(TypeArray *lhs = getType<TypeArray>(matchType))
	{
		// Only match with arrays of the same size
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(lhs->length == rhs->length)
			{
				if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
					return ctx.GetArrayType(match, lhs->length);

				return NULL;
			}
		}

		return NULL;
	}

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(matchType))
	{
		// 'generic[]' match with 'type[]' results with 'type[]'
		if(TypeUnsizedArray *rhs = getType<TypeUnsizedArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic[]' match with 'type[N]' results with 'type[]'
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);
		}

		return NULL;
	}

	if(TypeFunction *lhs = getType<TypeFunction>(matchType))
	{
		// Only match with other function type
		if(TypeFunction *rhs = getType<TypeFunction>(argType))
		{
			TypeBase *returnType = MatchGenericType(ctx, source, lhs->returnType, rhs->returnType, aliases, true);

			if(!returnType)
				return NULL;

			IntrusiveList<TypeHandle> arguments;

			TypeHandle *lhsArg = lhs->arguments.head;
			TypeHandle *rhsArg = rhs->arguments.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argMatched));

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			// Different number of arguments
			if(lhsArg || rhsArg)
				return NULL;

			return ctx.GetFunctionType(source, returnType, arguments);
		}

		return NULL;
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs->proto != rhs->proto)
				return NULL;

			TypeHandle *lhsArg = lhs->generics.head;
			MatchData *rhsArg = rhs->generics.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			return argType;
		}

		return NULL;
	}

	if(TypeGenericClassProto *lhs = getType<TypeGenericClassProto>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs != rhs->proto)
				return NULL;

			return argType;
		}

		return NULL;
	}

	Stop(ctx, source, "ERROR: unknown generic type match");

	return NULL;
}